

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr)

{
  Network NVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet(this);
  NVar1 = addr->m_net;
  if (NVar1 < 8) {
    if ((0x38U >> (NVar1 & 0x1f) & 1) == 0) {
      if ((0xc1U >> (NVar1 & 0x1f) & 1) != 0) goto LAB_00585241;
      this->valid = true;
      uVar2 = (addr->m_addr)._size;
      uVar4 = uVar2 - 0x11;
      if (uVar2 < 0x11) {
        uVar4 = uVar2;
      }
      if (0x10 < uVar4) {
        __assert_fail("addr.m_addr.size() <= sizeof(netmask)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                      ,1000,"CSubNet::CSubNet(const CNetAddr &)");
      }
      memset(this->netmask,0xff,(ulong)uVar4);
    }
    else {
      this->valid = true;
    }
  }
  CNetAddr::operator=(&this->network,addr);
LAB_00585241:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr) : CSubNet()
{
    switch (addr.m_net) {
    case NET_IPV4:
    case NET_IPV6:
        valid = true;
        assert(addr.m_addr.size() <= sizeof(netmask));
        memset(netmask, 0xFF, addr.m_addr.size());
        break;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
        valid = true;
        break;
    case NET_INTERNAL:
    case NET_UNROUTABLE:
    case NET_MAX:
        return;
    }

    network = addr;
}